

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test_output.cpp
# Opt level: O0

void __thiscall
Contact::Contact(Contact *this,string *last_name,string *first_name,string *tel_num,string *email)

{
  string *email_local;
  string *tel_num_local;
  string *first_name_local;
  string *last_name_local;
  Contact *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)last_name);
  std::__cxx11::string::string((string *)&this->first_name,(string *)first_name);
  std::__cxx11::string::string((string *)&this->tel_num,(string *)tel_num);
  std::__cxx11::string::string((string *)&this->email,(string *)email);
  return;
}

Assistant:

Contact(const std::string& last_name,
		const std::string& first_name,
		const std::string& tel_num,
		const std::string& email)
		: last_name{last_name},
		first_name{first_name},
		tel_num{tel_num},
		email{email} {}